

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::toTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,RenderBits renderBits)

{
  char *__s;
  string *psVar1;
  bool bVar2;
  size_t sVar3;
  bool *pbVar4;
  long lVar5;
  ostringstream stream;
  undefined1 auStack_1b8 [8];
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  bVar2 = true;
  lVar5 = 0;
  do {
    if ((*(uint *)((long)&DAT_021b7450 + lVar5) & (uint)this) != 0) {
      pbVar4 = (bool *)0x1c94005;
      if (bVar2) {
        pbVar4 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pbVar4,(ulong)((byte)~bVar2 & 1));
      __s = *(char **)((long)&DAT_021b7458 + lVar5);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      }
      bVar2 = false;
    }
    psVar1 = local_1b0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

string toTestName (RenderBits renderBits)
{
	struct
	{
		RenderBits	bit;
		const char*	str;
	} bitInfos[] =
	{
		{ RENDERBITS_AS_VERTEX_ARRAY,		"as_vertex_array"		},
		{ RENDERBITS_AS_INDEX_ARRAY,		"as_index_array"		},
		{ RENDERBITS_AS_VERTEX_TEXTURE,		"as_vertex_texture"		},
		{ RENDERBITS_AS_FRAGMENT_TEXTURE,	"as_fragment_texture"	}
	};

	std::ostringstream	stream;
	bool				first	= true;

	DE_ASSERT(renderBits != 0);

	for (int infoNdx = 0; infoNdx < DE_LENGTH_OF_ARRAY(bitInfos); infoNdx++)
	{
		if (renderBits & bitInfos[infoNdx].bit)
		{
			stream << (first ? "" : "_") << bitInfos[infoNdx].str;
			first = false;
		}
	}

	return stream.str();
}